

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O2

int AF_AActor_A_DamageChildren
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  int amount;
  int selector;
  bool bVar1;
  AActor *source;
  AActor *inflictor;
  AActor *dmgtarget;
  AActor *pAVar2;
  AActor *origin;
  PClassActor *filter;
  int selector_00;
  char *pcVar3;
  int local_60;
  int local_5c;
  int local_58;
  FName local_50;
  FName local_4c;
  TThinkerIterator<AActor> it;
  
  if (numparam < 1) {
    pcVar3 = "(paramnum) < numparam";
    goto LAB_003ed8a6;
  }
  if ((param->field_0).field_3.Type != '\x03') {
LAB_003ed877:
    pcVar3 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
LAB_003ed8a6:
    __assert_fail(pcVar3,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x1725,
                  "int AF_AActor_A_DamageChildren(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  origin = (AActor *)(param->field_0).field_1.a;
  if ((param->field_0).field_1.atag == 1) {
    if (origin == (AActor *)0x0) goto LAB_003ed673;
    bVar1 = DObject::IsKindOf((DObject *)origin,AActor::RegistrationInfo.MyClass);
    if (!bVar1) {
      pcVar3 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_003ed8a6;
    }
  }
  else {
    if (origin != (AActor *)0x0) goto LAB_003ed877;
LAB_003ed673:
    origin = (AActor *)0x0;
  }
  if (numparam == 1) {
    pcVar3 = "(paramnum) < numparam";
LAB_003ed8ce:
    __assert_fail(pcVar3,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x1726,
                  "int AF_AActor_A_DamageChildren(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  if (param[1].field_0.field_3.Type != '\0') {
    pcVar3 = "param[paramnum].Type == REGT_INT";
    goto LAB_003ed8ce;
  }
  amount = param[1].field_0.i;
  if ((uint)numparam < 3) {
    param = defaultparam->Array;
    if (param[2].field_0.field_3.Type != '\0') {
      pcVar3 = "(defaultparam[paramnum]).Type == REGT_INT";
      goto LAB_003ed95c;
    }
    local_58 = param[2].field_0.i;
LAB_003ed6d2:
    if (param[3].field_0.field_3.Type != '\0') {
      pcVar3 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_003ed97b:
      __assert_fail(pcVar3,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x1728,
                    "int AF_AActor_A_DamageChildren(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    local_5c = param[3].field_0.i;
LAB_003ed6e5:
    if (param[4].field_0.field_3.Type != '\x03') {
LAB_003ed880:
      pcVar3 = 
      "(defaultparam[paramnum]).Type == REGT_POINTER && ((defaultparam[paramnum]).atag == ATAG_OBJECT || (defaultparam[paramnum]).a == nullptr)"
      ;
LAB_003ed887:
      __assert_fail(pcVar3,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x1729,
                    "int AF_AActor_A_DamageChildren(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    filter = (PClassActor *)param[4].field_0.field_1.a;
    if (param[4].field_0.field_1.atag != 1) {
      if (filter != (PClassActor *)0x0) goto LAB_003ed880;
      filter = (PClassActor *)0x0;
    }
LAB_003ed706:
    if (param[5].field_0.field_3.Type != '\0') {
      pcVar3 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_003ed92b:
      __assert_fail(pcVar3,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x172a,
                    "int AF_AActor_A_DamageChildren(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    local_60 = param[5].field_0.i;
LAB_003ed719:
    if (param[6].field_0.field_3.Type != '\0') {
      pcVar3 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_003ed90c:
      __assert_fail(pcVar3,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x172b,
                    "int AF_AActor_A_DamageChildren(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    selector_00 = param[6].field_0.i;
  }
  else {
    if (param[2].field_0.field_3.Type != '\0') {
      pcVar3 = "(param[paramnum]).Type == REGT_INT";
LAB_003ed95c:
      __assert_fail(pcVar3,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x1727,
                    "int AF_AActor_A_DamageChildren(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    local_58 = param[2].field_0.i;
    if (numparam == 3) {
      param = defaultparam->Array;
      goto LAB_003ed6d2;
    }
    if (param[3].field_0.field_3.Type != '\0') {
      pcVar3 = "(param[paramnum]).Type == REGT_INT";
      goto LAB_003ed97b;
    }
    local_5c = param[3].field_0.i;
    if ((uint)numparam < 5) {
      param = defaultparam->Array;
      goto LAB_003ed6e5;
    }
    if ((param[4].field_0.field_3.Type != '\x03') ||
       (filter = (PClassActor *)param[4].field_0.field_1.a,
       filter != (PClassActor *)0x0 && param[4].field_0.field_1.atag != 1)) {
      pcVar3 = 
      "(param[paramnum]).Type == REGT_POINTER && ((param[paramnum]).atag == ATAG_OBJECT || (param[paramnum]).a == nullptr)"
      ;
      goto LAB_003ed887;
    }
    if (numparam == 5) {
      param = defaultparam->Array;
      goto LAB_003ed706;
    }
    if (param[5].field_0.field_3.Type != '\0') {
      pcVar3 = "(param[paramnum]).Type == REGT_INT";
      goto LAB_003ed92b;
    }
    local_60 = param[5].field_0.i;
    if ((uint)numparam < 7) {
      param = defaultparam->Array;
      goto LAB_003ed719;
    }
    if (param[6].field_0.field_3.Type != '\0') {
      pcVar3 = "(param[paramnum]).Type == REGT_INT";
      goto LAB_003ed90c;
    }
    selector_00 = param[6].field_0.i;
    if (numparam != 7) {
      if (param[7].field_0.field_3.Type != '\0') {
        pcVar3 = "(param[paramnum]).Type == REGT_INT";
        goto LAB_003ed8ed;
      }
      goto LAB_003ed733;
    }
    param = defaultparam->Array;
  }
  if (param[7].field_0.field_3.Type != '\0') {
    pcVar3 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_003ed8ed:
    __assert_fail(pcVar3,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x172c,
                  "int AF_AActor_A_DamageChildren(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
LAB_003ed733:
  selector = param[7].field_0.i;
  source = COPY_AAPTR(origin,selector_00);
  inflictor = COPY_AAPTR(origin,selector);
  TThinkerIterator<AActor>::TThinkerIterator
            ((TThinkerIterator<AActor> *)&it.super_FThinkerIterator,0x80);
  while( true ) {
    dmgtarget = (AActor *)FThinkerIterator::Next(&it.super_FThinkerIterator,false);
    if (dmgtarget == (AActor *)0x0) break;
    pAVar2 = GC::ReadBarrier<AActor>((AActor **)&dmgtarget->master);
    if (pAVar2 == origin) {
      local_4c.Index = local_58;
      local_50.Index = local_60;
      DoDamage(dmgtarget,inflictor,source,amount,&local_4c,local_5c,filter,&local_50);
    }
  }
  return 0;
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_DamageChildren)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_INT		(amount);
	PARAM_NAME_DEF	(damagetype)	
	PARAM_INT_DEF	(flags)			
	PARAM_CLASS_DEF	(filter, AActor)
	PARAM_NAME_DEF	(species)		
	PARAM_INT_DEF	(src)			
	PARAM_INT_DEF	(inflict)		

	AActor *source = COPY_AAPTR(self, src);
	AActor *inflictor = COPY_AAPTR(self, inflict);

	TThinkerIterator<AActor> it;
	AActor *mo;

	while ( (mo = it.Next()) )
	{
		if (mo->master == self)
			DoDamage(mo, inflictor, source, amount, damagetype, flags, filter, species);
	}
	return 0;
}